

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O0

bool __thiscall IRC_Bot::freeCommand(IRC_Bot *this,string_view trigger)

{
  bool bVar1;
  reference this_00;
  pointer pIVar2;
  ulong uVar3;
  const_iterator local_50;
  size_t local_48;
  char *local_40;
  __normal_iterator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_*,_std::vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>_>
  local_38;
  __normal_iterator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_*,_std::vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>_>
  local_30;
  iterator itr;
  IRC_Bot *this_local;
  string_view trigger_local;
  
  itr._M_current = (unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_> *)this;
  local_30._M_current =
       (unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_> *)
       std::
       vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
       ::begin(&this->m_commands);
  while( true ) {
    local_38._M_current =
         (unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_> *)
         std::
         vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
         ::end(&this->m_commands);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_*,_std::vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>_>
                      (&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_*,_std::vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>_>
              ::operator*(&local_30);
    pIVar2 = std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>::operator->(this_00);
    local_48 = trigger._M_len;
    local_40 = trigger._M_str;
    uVar3 = Jupiter::Command::matches(pIVar2,trigger._M_len,trigger._M_str);
    if ((uVar3 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_*,_std::vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>_>
    ::operator++(&local_30);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>const*,std::vector<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>,std::allocator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>>>>
  ::__normal_iterator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>*>
            ((__normal_iterator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>const*,std::vector<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>,std::allocator<std::unique_ptr<IRCCommand,std::default_delete<IRCCommand>>>>>
              *)&local_50,&local_30);
  std::
  vector<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
  ::erase(&this->m_commands,local_50);
  return true;
}

Assistant:

bool IRC_Bot::freeCommand(std::string_view trigger) {
	for (auto itr = m_commands.begin(); itr != m_commands.end(); ++itr) {
		if ((*itr)->matches(trigger)) {
			m_commands.erase(itr);
			return true;
		}
	}

	return false;
}